

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

ma_result ma_spatializer_process_pcm_frames
                    (ma_spatializer *pSpatializer,ma_spatializer_listener *pListener,
                    void *pFramesOut,void *pFramesIn,ma_uint64 frameCount)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  float fVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  byte channelPosition;
  ma_uint32 mVar14;
  uint channelsOut;
  ma_attenuation_model mVar15;
  ma_channel *pChannelMapIn;
  ma_channel *pChannelMapOut;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [12];
  ma_vec3f dirA;
  ma_bool32 mVar19;
  float *pfVar20;
  ulong uVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  ma_vec3f dirB;
  ma_vec3f dirB_00;
  ma_channel_mix_mode in_stack_fffffffffffffef0;
  ma_vec3f relativePos;
  float local_f8;
  ma_vec3f relativeDir;
  float local_78;
  float fStack_74;
  
  pChannelMapIn = pSpatializer->pChannelMapIn;
  pChannelMapOut = (pListener->config).pChannelMapOut;
  if (pSpatializer->attenuationModel == ma_attenuation_model_none) {
    if (pListener->isEnabled == 0) {
      ma_silence_pcm_frames(pFramesOut,frameCount,ma_format_f32,pSpatializer->channelsOut);
    }
    else {
      mVar14 = pSpatializer->channelsIn;
      if (mVar14 == pSpatializer->channelsOut) {
        ma_copy_pcm_frames(pFramesOut,pFramesIn,frameCount,ma_format_f32,mVar14);
      }
      else {
        ma_channel_map_apply_f32
                  ((float *)pFramesOut,pChannelMapOut,pSpatializer->channelsOut,(float *)pFramesIn,
                   pChannelMapIn,mVar14,frameCount,in_stack_fffffffffffffef0,
                   (ma_mono_expansion_mode)relativePos.x);
      }
    }
    pSpatializer->dopplerPitch = 1.0;
    return MA_SUCCESS;
  }
  mVar14 = pSpatializer->channelsIn;
  channelsOut = pSpatializer->channelsOut;
  fVar22 = pSpatializer->minDistance;
  fVar23 = pSpatializer->maxDistance;
  fVar27 = pSpatializer->rolloff;
  fVar1 = pSpatializer->dopplerFactor;
  uVar4 = (pListener->velocity).x;
  uVar9 = (pListener->velocity).y;
  fVar2 = (pListener->velocity).z;
  fVar3 = (pListener->config).speedOfSound;
  if (pSpatializer->positioning == ma_positioning_relative) {
    relativePos.z = (pSpatializer->position).z;
    relativePos.x = (pSpatializer->position).x;
    relativePos.y = (pSpatializer->position).y;
    relativeDir.x = (pSpatializer->direction).x;
    relativeDir.y = (pSpatializer->direction).y;
    relativeDir.z = (pSpatializer->direction).z;
  }
  else {
    ma_spatializer_get_relative_position_and_direction
              (pSpatializer,pListener,&relativePos,&relativeDir);
  }
  fVar5 = SQRT(relativePos.z * relativePos.z +
               relativePos.x * relativePos.x + relativePos.y * relativePos.y);
  mVar15 = pSpatializer->attenuationModel;
  fVar26 = 1.0;
  if (mVar15 == ma_attenuation_model_exponential) {
    if (fVar22 < fVar23) {
      fVar26 = fVar5;
      if (fVar23 <= fVar5) {
        fVar26 = fVar23;
      }
      fVar23 = fVar22;
      if (fVar22 <= fVar26) {
        fVar23 = fVar26;
      }
      dVar16 = pow((double)(fVar23 / fVar22),(double)-fVar27);
      fVar26 = (float)dVar16;
    }
  }
  else if (mVar15 == ma_attenuation_model_linear) {
    if (fVar22 < fVar23) {
      fVar26 = fVar5;
      if (fVar23 <= fVar5) {
        fVar26 = fVar23;
      }
      fVar10 = fVar22;
      if (fVar22 <= fVar26) {
        fVar10 = fVar26;
      }
      fVar26 = 1.0 - ((fVar10 - fVar22) * fVar27) / (fVar23 - fVar22);
    }
  }
  else if ((mVar15 == ma_attenuation_model_inverse) && (fVar22 < fVar23)) {
    fVar26 = fVar5;
    if (fVar23 <= fVar5) {
      fVar26 = fVar23;
    }
    fVar23 = fVar22;
    if (fVar22 <= fVar26) {
      fVar23 = fVar26;
    }
    fVar26 = fVar22 / (fVar27 * (fVar23 - fVar22) + fVar22);
  }
  if (fVar5 <= 0.001) {
    local_f8 = 0.0;
  }
  else {
    fVar23 = 1.0 / fVar5;
    fVar27 = fVar23 * relativePos.x;
    fVar10 = fVar23 * relativePos.y;
    fVar23 = fVar23 * relativePos.z;
    dirB._0_8_ = CONCAT44(fVar10,fVar27) ^ 0x8000000080000000;
    dirB.z = -fVar23;
    dirA.z = relativeDir.z;
    dirA.x = relativeDir.x;
    dirA.y = relativeDir.y;
    fVar22 = ma_calculate_angular_gain
                       (dirA,dirB,pSpatializer->coneInnerAngleInRadians,
                        pSpatializer->coneOuterAngleInRadians,pSpatializer->coneOuterGain);
    fVar26 = fVar26 * fVar22;
    fVar22 = (pListener->config).coneInnerAngleInRadians;
    local_f8 = fVar5;
    if (fVar22 < 6.283185) {
      dirB_00.y = fVar10;
      dirB_00.x = fVar27;
      auVar18._4_8_ = 0;
      auVar18._0_4_ =
           *(uint *)(&DAT_001ae350 +
                    (ulong)((pListener->config).handedness == ma_handedness_right) * 4);
      dirB_00.z = fVar23;
      fVar22 = ma_calculate_angular_gain
                         ((ma_vec3f)(auVar18 << 0x40),dirB_00,fVar22,
                          (pListener->config).coneOuterAngleInRadians,
                          (pListener->config).coneOuterGain);
      fVar26 = fVar26 * fVar22;
    }
  }
  pfVar20 = &pSpatializer->maxGain;
  fVar22 = fVar26;
  if (pSpatializer->maxGain <= fVar26) {
    fVar22 = *pfVar20;
  }
  if (pSpatializer->minGain <= fVar22) {
    if (fVar26 < *pfVar20) goto LAB_001910df;
  }
  else {
    pfVar20 = &pSpatializer->minGain;
  }
  fVar26 = *pfVar20;
LAB_001910df:
  if (pChannelMapOut != (ma_channel *)0x0) {
    for (uVar21 = 0; channelsOut != uVar21; uVar21 = uVar21 + 1) {
      pSpatializer->pNewChannelGainsOut[uVar21] = fVar26;
    }
    if (pListener->isEnabled == 0) {
      ma_silence_pcm_frames(pFramesOut,frameCount,ma_format_f32,pSpatializer->channelsOut);
    }
    else {
      ma_channel_map_apply_f32
                ((float *)pFramesOut,pChannelMapOut,channelsOut,(float *)pFramesIn,pChannelMapIn,
                 mVar14,frameCount,in_stack_fffffffffffffef0,(ma_mono_expansion_mode)relativePos.x);
    }
    if (0.001 < fVar5) {
      fVar22 = relativePos.x;
      fVar23 = relativePos.y;
      local_f8 = 1.0 / local_f8;
      fVar27 = local_f8 * relativePos.z;
      for (uVar21 = 0; channelsOut != uVar21; uVar21 = uVar21 + 1) {
        channelPosition = pChannelMapOut[uVar21];
        mVar19 = ma_is_spatial_channel_position(channelPosition);
        fVar26 = 1.0;
        if (mVar19 != 0) {
          fVar5 = 0.0;
          fVar10 = 0.0;
          fVar26 = -1.0;
          if (channelPosition < 0x34) {
            fVar5 = g_maChannelDirections[channelPosition].x;
            fVar10 = g_maChannelDirections[channelPosition].y;
            fVar26 = g_maChannelDirections[channelPosition].z;
          }
          fVar26 = ((fVar10 * fVar23 * local_f8 + local_f8 * fVar22 * fVar5 + fVar26 * fVar27 + -1.0
                    ) * pSpatializer->directionalAttenuationFactor + 1.0 + 1.0) * 0.5;
        }
        if (fVar26 <= 0.2) {
          fVar26 = 0.2;
        }
        pSpatializer->pNewChannelGainsOut[uVar21] =
             fVar26 * pSpatializer->pNewChannelGainsOut[uVar21];
      }
    }
    ma_gainer_set_gains(&pSpatializer->gainer,pSpatializer->pNewChannelGainsOut);
    ma_gainer_process_pcm_frames(&pSpatializer->gainer,pFramesOut,pFramesOut,frameCount);
    fVar22 = 1.0;
    if (0.0 < fVar1) {
      uVar6 = (pListener->position).x;
      uVar11 = (pListener->position).y;
      uVar7 = (pSpatializer->position).x;
      uVar12 = (pSpatializer->position).y;
      fVar27 = (float)uVar6 - (float)uVar7;
      fVar26 = (float)uVar11 - (float)uVar12;
      fVar23 = (pListener->position).z - (pSpatializer->position).z;
      fVar5 = SQRT(fVar23 * fVar23 + fVar27 * fVar27 + fVar26 * fVar26);
      if ((fVar5 != 0.0) || (NAN(fVar5))) {
        uVar8 = (pSpatializer->velocity).x;
        uVar13 = (pSpatializer->velocity).y;
        fVar22 = fVar3 / fVar1;
        auVar24._0_4_ = fVar2 * fVar23 + (float)uVar4 * fVar27 + (float)uVar9 * fVar26;
        auVar24._4_4_ =
             (pSpatializer->velocity).z * fVar23 + (float)uVar8 * fVar27 + (float)uVar13 * fVar26;
        auVar24._8_4_ = fVar23 * 0.0 + (float)uVar9 * fVar27 + fVar26 * 0.0;
        auVar24._12_4_ = fVar23 * 0.0 + (float)uVar13 * fVar27 + fVar26 * 0.0;
        auVar25._4_4_ = fVar5;
        auVar25._0_4_ = fVar5;
        auVar25._8_4_ = fVar5;
        auVar25._12_4_ = fVar5;
        auVar25 = divps(auVar24,auVar25);
        auVar17._4_4_ = fVar22;
        auVar17._0_4_ = fVar22;
        auVar17._8_4_ = fVar22;
        auVar17._12_4_ = fVar22;
        auVar25 = minps(auVar25,auVar17);
        fVar22 = (fVar3 - fVar1 * auVar25._0_4_) / (fVar3 - fVar1 * auVar25._4_4_);
      }
    }
    pSpatializer->dopplerPitch = fVar22;
    return MA_SUCCESS;
  }
  __assert_fail("pChannelMapOut != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                ,0x9414,
                "ma_result ma_spatializer_process_pcm_frames(ma_spatializer *, ma_spatializer_listener *, void *, const void *, ma_uint64)"
               );
}

Assistant:

MA_API ma_result ma_spatializer_process_pcm_frames(ma_spatializer* pSpatializer, ma_spatializer_listener* pListener, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    ma_channel* pChannelMapIn  = pSpatializer->pChannelMapIn;
    ma_channel* pChannelMapOut = pListener->config.pChannelMapOut;

    if (pSpatializer == NULL) {
        return MA_INVALID_ARGS;
    }

    /* If we're not spatializing we need to run an optimized path. */
    if (c89atomic_load_i32(&pSpatializer->attenuationModel) == ma_attenuation_model_none) {
        if (ma_spatializer_listener_is_enabled(pListener)) {
            /* No attenuation is required, but we'll need to do some channel conversion. */
            if (pSpatializer->channelsIn == pSpatializer->channelsOut) {
                ma_copy_pcm_frames(pFramesOut, pFramesIn, frameCount, ma_format_f32, pSpatializer->channelsIn);
            } else {
                ma_channel_map_apply_f32((float*)pFramesOut, pChannelMapOut, pSpatializer->channelsOut, (const float*)pFramesIn, pChannelMapIn, pSpatializer->channelsIn, frameCount, ma_channel_mix_mode_rectangular, ma_mono_expansion_mode_default);   /* Safe casts to float* because f32 is the only supported format. */
            }
        } else {
            /* The listener is disabled. Output silence. */
            ma_silence_pcm_frames(pFramesOut, frameCount, ma_format_f32, pSpatializer->channelsOut);
        }

        /*
        We're not doing attenuation so don't bother with doppler for now. I'm not sure if this is
        the correct thinking so might need to review this later.
        */
        pSpatializer->dopplerPitch = 1;
    } else {
        /*
        Let's first determine which listener the sound is closest to. Need to keep in mind that we
        might not have a world or any listeners, in which case we just spatializer based on the
        listener being positioned at the origin (0, 0, 0).
        */
        ma_vec3f relativePosNormalized;
        ma_vec3f relativePos;   /* The position relative to the listener. */
        ma_vec3f relativeDir;   /* The direction of the sound, relative to the listener. */
        ma_vec3f listenerVel;   /* The volocity of the listener. For doppler pitch calculation. */
        float speedOfSound;
        float distance = 0;
        float gain = 1;
        ma_uint32 iChannel;
        const ma_uint32 channelsOut = pSpatializer->channelsOut;
        const ma_uint32 channelsIn  = pSpatializer->channelsIn;
        float minDistance = ma_spatializer_get_min_distance(pSpatializer);
        float maxDistance = ma_spatializer_get_max_distance(pSpatializer);
        float rolloff = ma_spatializer_get_rolloff(pSpatializer);
        float dopplerFactor = ma_spatializer_get_doppler_factor(pSpatializer);

        /*
        We'll need the listener velocity for doppler pitch calculations. The speed of sound is
        defined by the listener, so we'll grab that here too.
        */
        if (pListener != NULL) {
            listenerVel  = pListener->velocity;
            speedOfSound = pListener->config.speedOfSound;
        } else {
            listenerVel  = ma_vec3f_init_3f(0, 0, 0);
            speedOfSound = MA_DEFAULT_SPEED_OF_SOUND;
        }

        if (pListener == NULL || ma_spatializer_get_positioning(pSpatializer) == ma_positioning_relative) {
            /* There's no listener or we're using relative positioning. */
            relativePos = pSpatializer->position;
            relativeDir = pSpatializer->direction;
        } else {
            /*
            We've found a listener and we're using absolute positioning. We need to transform the
            sound's position and direction so that it's relative to listener. Later on we'll use
            this for determining the factors to apply to each channel to apply the panning effect.
            */
            ma_spatializer_get_relative_position_and_direction(pSpatializer, pListener, &relativePos, &relativeDir);
        }

        distance = ma_vec3f_len(relativePos);

        /* We've gathered the data, so now we can apply some spatialization. */
        switch (ma_spatializer_get_attenuation_model(pSpatializer)) {
            case ma_attenuation_model_inverse:
            {
                gain = ma_attenuation_inverse(distance, minDistance, maxDistance, rolloff);
            } break;
            case ma_attenuation_model_linear:
            {
                gain = ma_attenuation_linear(distance, minDistance, maxDistance, rolloff);
            } break;
            case ma_attenuation_model_exponential:
            {
                gain = ma_attenuation_exponential(distance, minDistance, maxDistance, rolloff);
            } break;
            case ma_attenuation_model_none:
            default:
            {
                gain = 1;
            } break;
        }

        /* Normalize the position. */
        if (distance > 0.001f) {
            float distanceInv = 1/distance;
            relativePosNormalized    = relativePos;
            relativePosNormalized.x *= distanceInv;
            relativePosNormalized.y *= distanceInv;
            relativePosNormalized.z *= distanceInv;
        } else {
            distance = 0;
            relativePosNormalized = ma_vec3f_init_3f(0, 0, 0);
        }

        /*
        Angular attenuation.

        Unlike distance gain, the math for this is not specified by the OpenAL spec so we'll just go ahead and figure
        this out for ourselves at the expense of possibly being inconsistent with other implementations.

        To do cone attenuation, I'm just using the same math that we'd use to implement a basic spotlight in OpenGL. We
        just need to get the direction from the source to the listener and then do a dot product against that and the
        direction of the spotlight. Then we just compare that dot product against the cosine of the inner and outer
        angles. If the dot product is greater than the the outer angle, we just use coneOuterGain. If it's less than
        the inner angle, we just use a gain of 1. Otherwise we linearly interpolate between 1 and coneOuterGain.
        */
        if (distance > 0) {
            /* Source anglular gain. */
            float spatializerConeInnerAngle;
            float spatializerConeOuterAngle;
            float spatializerConeOuterGain;
            ma_spatializer_get_cone(pSpatializer, &spatializerConeInnerAngle, &spatializerConeOuterAngle, &spatializerConeOuterGain);

            gain *= ma_calculate_angular_gain(relativeDir, ma_vec3f_neg(relativePosNormalized), spatializerConeInnerAngle, spatializerConeOuterAngle, spatializerConeOuterGain);

            /*
            We're supporting angular gain on the listener as well for those who want to reduce the volume of sounds that
            are positioned behind the listener. On default settings, this will have no effect.
            */
            if (pListener != NULL && pListener->config.coneInnerAngleInRadians < 6.283185f) {
                ma_vec3f listenerDirection;
                float listenerInnerAngle;
                float listenerOuterAngle;
                float listenerOuterGain;

                if (pListener->config.handedness == ma_handedness_right) {
                    listenerDirection = ma_vec3f_init_3f(0, 0, -1);
                } else {
                    listenerDirection = ma_vec3f_init_3f(0, 0, +1);
                }

                listenerInnerAngle = pListener->config.coneInnerAngleInRadians;
                listenerOuterAngle = pListener->config.coneOuterAngleInRadians;
                listenerOuterGain  = pListener->config.coneOuterGain;

                gain *= ma_calculate_angular_gain(listenerDirection, relativePosNormalized, listenerInnerAngle, listenerOuterAngle, listenerOuterGain);
            }
        } else {
            /* The sound is right on top of the listener. Don't do any angular attenuation. */
        }


        /* Clamp the gain. */
        gain = ma_clamp(gain, ma_spatializer_get_min_gain(pSpatializer), ma_spatializer_get_max_gain(pSpatializer));

        /*
        Panning. This is where we'll apply the gain and convert to the output channel count. We have an optimized path for
        when we're converting to a mono stream. In that case we don't really need to do any panning - we just apply the
        gain to the final output.
        */
        /*printf("distance=%f; gain=%f\n", distance, gain);*/

        /* We must have a valid channel map here to ensure we spatialize properly. */
        MA_ASSERT(pChannelMapOut != NULL);

        /*
        We're not converting to mono so we'll want to apply some panning. This is where the feeling of something being
        to the left, right, infront or behind the listener is calculated. I'm just using a basic model here. Note that
        the code below is not based on any specific algorithm. I'm just implementing this off the top of my head and
        seeing how it goes. There might be better ways to do this.

        To determine the direction of the sound relative to a speaker I'm using dot products. Each speaker is given a
        direction. For example, the left channel in a stereo system will be -1 on the X axis and the right channel will
        be +1 on the X axis. A dot product is performed against the direction vector of the channel and the normalized
        position of the sound.
        */
        for (iChannel = 0; iChannel < channelsOut; iChannel += 1) {
            pSpatializer->pNewChannelGainsOut[iChannel] = gain;
        }

        /*
        Convert to our output channel count. If the listener is disabled we just output silence here. We cannot ignore
        the whole section of code here because we need to update some internal spatialization state.
        */
        if (ma_spatializer_listener_is_enabled(pListener)) {
            ma_channel_map_apply_f32((float*)pFramesOut, pChannelMapOut, channelsOut, (const float*)pFramesIn, pChannelMapIn, channelsIn, frameCount, ma_channel_mix_mode_rectangular, ma_mono_expansion_mode_default);
        } else {
            ma_silence_pcm_frames(pFramesOut, frameCount, ma_format_f32, pSpatializer->channelsOut);
        }

        /*
        Calculate our per-channel gains. We do this based on the normalized relative position of the sound and it's
        relation to the direction of the channel.
        */
        if (distance > 0) {
            ma_vec3f unitPos = relativePos;
            float distanceInv = 1/distance;
            unitPos.x *= distanceInv;
            unitPos.y *= distanceInv;
            unitPos.z *= distanceInv;

            for (iChannel = 0; iChannel < channelsOut; iChannel += 1) {
                ma_channel channelOut;
                float d;
                float dMin;

                channelOut = ma_channel_map_get_channel(pChannelMapOut, channelsOut, iChannel);
                if (ma_is_spatial_channel_position(channelOut)) {
                    d = ma_mix_f32_fast(1, ma_vec3f_dot(unitPos, ma_get_channel_direction(channelOut)), ma_spatializer_get_directional_attenuation_factor(pSpatializer));
                } else {
                    d = 1;  /* It's not a spatial channel so there's no real notion of direction. */
                }

                /*
                In my testing, if the panning effect is too aggressive it makes spatialization feel uncomfortable.
                The "dMin" variable below is used to control the aggressiveness of the panning effect. When set to
                0, panning will be most extreme and any sounds that are positioned on the opposite side of the
                speaker will be completely silent from that speaker. Not only does this feel uncomfortable, it
                doesn't even remotely represent the real world at all because sounds that come from your right side
                are still clearly audible from your left side. Setting "dMin" to 1 will  result in no panning at
                all, which is also not ideal. By setting it to something greater than 0, the spatialization effect
                becomes much less dramatic and a lot more bearable.

                Summary: 0 = more extreme panning; 1 = no panning.
                */
                dMin = 0.2f;  /* TODO: Consider making this configurable. */

                /*
                At this point, "d" will be positive if the sound is on the same side as the channel and negative if
                it's on the opposite side. It will be in the range of -1..1. There's two ways I can think of to
                calculate a panning value. The first is to simply convert it to 0..1, however this has a problem
                which I'm not entirely happy with. Considering a stereo system, when a sound is positioned right
                in front of the listener it'll result in each speaker getting a gain of 0.5. I don't know if I like
                the idea of having a scaling factor of 0.5 being applied to a sound when it's sitting right in front
                of the listener. I would intuitively expect that to be played at full volume, or close to it.

                The second idea I think of is to only apply a reduction in gain when the sound is on the opposite
                side of the speaker. That is, reduce the gain only when the dot product is negative. The problem
                with this is that there will not be any attenuation as the sound sweeps around the 180 degrees
                where the dot product is positive. The idea with this option is that you leave the gain at 1 when
                the sound is being played on the same side as the speaker and then you just reduce the volume when
                the sound is on the other side.

                The summarize, I think the first option should give a better sense of spatialization, but the second
                option is better for preserving the sound's power.

                UPDATE: In my testing, I find the first option to sound better. You can feel the sense of space a
                bit better, but you can also hear the reduction in volume when it's right in front.
                */
                #if 1
                {
                    /*
                    Scale the dot product from -1..1 to 0..1. Will result in a sound directly in front losing power
                    by being played at 0.5 gain.
                    */
                    d = (d + 1) * 0.5f;  /* -1..1 to 0..1 */
                    d = ma_max(d, dMin);
                    pSpatializer->pNewChannelGainsOut[iChannel] *= d;
                }
                #else
                {
                    /*
                    Only reduce the volume of the sound if it's on the opposite side. This path keeps the volume more
                    consistent, but comes at the expense of a worse sense of space and positioning.
                    */
                    if (d < 0) {
                        d += 1; /* Move into the positive range. */
                        d = ma_max(d, dMin);
                        channelGainsOut[iChannel] *= d;
                    }
                }
                #endif
            }
        } else {
            /* Assume the sound is right on top of us. Don't do any panning. */
        }

        /* Now we need to apply the volume to each channel. This needs to run through the gainer to ensure we get a smooth volume transition. */
        ma_gainer_set_gains(&pSpatializer->gainer, pSpatializer->pNewChannelGainsOut);
        ma_gainer_process_pcm_frames(&pSpatializer->gainer, pFramesOut, pFramesOut, frameCount);

        /*
        Before leaving we'll want to update our doppler pitch so that the caller can apply some
        pitch shifting if they desire. Note that we need to negate the relative position here
        because the doppler calculation needs to be source-to-listener, but ours is listener-to-
        source.
        */
        if (dopplerFactor > 0) {
            pSpatializer->dopplerPitch = ma_doppler_pitch(ma_vec3f_sub(pListener->position, pSpatializer->position), pSpatializer->velocity, listenerVel, speedOfSound, dopplerFactor);
        } else {
            pSpatializer->dopplerPitch = 1;
        }
    }

    return MA_SUCCESS;
}